

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int iraf2mem(char *filename,char **buffptr,size_t *buffsize,size_t *filesize,int *status)

{
  int local_44;
  char *pcStack_40;
  int lenirafhead;
  char *irafheader;
  int *status_local;
  size_t *filesize_local;
  size_t *buffsize_local;
  char **buffptr_local;
  char *filename_local;
  
  *buffptr = (char *)0x0;
  *buffsize = 0;
  *filesize = 0;
  irafheader = (char *)status;
  status_local = (int *)filesize;
  filesize_local = buffsize;
  buffsize_local = (size_t *)buffptr;
  buffptr_local = (char **)filename;
  pcStack_40 = irafrdhead(filename,&local_44);
  if (pcStack_40 == (char *)0x0) {
    irafheader[0] = 'h';
    irafheader[1] = '\0';
    irafheader[2] = '\0';
    irafheader[3] = '\0';
    filename_local._4_4_ = 0x68;
  }
  else {
    iraftofits((char *)buffptr_local,pcStack_40,local_44,(char **)buffsize_local,filesize_local,
               (size_t *)status_local,(int *)irafheader);
    free(pcStack_40);
    if (*(int *)irafheader < 1) {
      *(ulong *)status_local = ((*(long *)status_local - 1U) / 0xb40 + 1) * 0xb40;
      irafrdimage((char **)buffsize_local,filesize_local,(size_t *)status_local,(int *)irafheader);
      filename_local._4_4_ = *(int *)irafheader;
    }
    else {
      filename_local._4_4_ = *(int *)irafheader;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int iraf2mem(char *filename,     /* name of input file                 */
             char **buffptr,     /* O - memory pointer (initially NULL)    */
             size_t *buffsize,   /* O - size of mem buffer, in bytes        */
             size_t *filesize,   /* O - size of FITS file, in bytes         */
             int *status)        /* IO - error status                       */

/*
   Driver routine that reads an IRAF image into memory, also converting
   it into FITS format.
*/
{
    char *irafheader;
    int lenirafhead;

    *buffptr = NULL;
    *buffsize = 0;
    *filesize = 0;

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    /* convert IRAF header to FITS header in memory */
    iraftofits(filename, irafheader, lenirafhead, buffptr, buffsize, filesize,
               status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    *filesize = (((*filesize - 1) / 2880 ) + 1 ) * 2880; /* multiple of 2880 */

    /* append the image data onto the FITS header */
    irafrdimage(buffptr, buffsize, filesize, status);

    return(*status);
}